

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

void __thiscall State::State(State *this,int w,int h,int *numbers)

{
  int iVar1;
  int **ppiVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  this->width = w;
  this->height = h;
  this->size = w * h;
  this->previous = (State *)0x0;
  uVar5 = (long)h * 8;
  if (h < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppiVar2 = (int **)operator_new__(uVar5);
  this->tiles = ppiVar2;
  if (0 < this->height) {
    lVar6 = 0;
    do {
      uVar5 = (long)this->width * 4;
      if ((long)this->width < 0) {
        uVar5 = 0xffffffffffffffff;
      }
      piVar3 = (int *)operator_new__(uVar5);
      this->tiles[lVar6] = piVar3;
      uVar5 = (ulong)(uint)this->width;
      if (0 < this->width) {
        piVar3 = this->tiles[lVar6];
        lVar4 = 0;
        do {
          iVar1 = numbers[(int)uVar5 * (int)lVar6 + lVar4];
          piVar3[lVar4] = iVar1;
          if (iVar1 == 0) {
            (this->blank).height = (int)lVar6;
            (this->blank).width = (int)lVar4;
          }
          lVar4 = lVar4 + 1;
          uVar5 = (ulong)this->width;
        } while (lVar4 < (long)uVar5);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->height);
  }
  return;
}

Assistant:

State::State(int w, int h, int* numbers) {
    width = w;
    height = h;
    size = w * h;
    previous = nullptr;

    tiles = new int *[height];
    for (int i = 0; i < height; i++) {
        tiles[i] = new int[width];

        for (int j = 0; j < width; j++) {
            tiles[i][j] = numbers[i * width + j];

            if (tiles[i][j] == 0) {
                blank.height = i;
                blank.width = j;
            }
        }
    }
}